

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void R_DrawPSprite(DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
                  double ticfrac)

{
  fixed_t *pfVar1;
  visstyle_t *pvVar2;
  vissprite_t *vis;
  float fVar3;
  double dVar4;
  byte bVar5;
  ushort uVar6;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  AInventory *pAVar7;
  lighttable_t *plVar8;
  lighttable_t *plVar9;
  bool bVar10;
  bool bVar11;
  vispsp_t *pvVar12;
  vissprite_t *pvVar13;
  fixed_t fVar14;
  int iVar15;
  PalEntry fade;
  int iVar16;
  AWeapon *pAVar17;
  FDynamicColormap *pFVar18;
  BYTE *pBVar19;
  short sVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  DObject *p;
  FTexture *pFVar25;
  bool bVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  FRenderStyle style;
  FRenderStyle local_34;
  
  if (R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') {
    R_DrawPSprite();
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    uVar23 = (R_DrawPSprite::avis.Count - vispspindex) + 1;
    TArray<vissprite_t,_vissprite_t>::Grow(&R_DrawPSprite::avis,uVar23);
    R_DrawPSprite::avis.Count = R_DrawPSprite::avis.Count + uVar23;
  }
  uVar23 = pspr->Sprite;
  if (sprites.Count <= uVar23) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar23].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar21 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar23].spriteframes;
  uVar22 = (ulong)SpriteFrames.Array[lVar21].Texture[0].texnum;
  if (uVar22 < TexMan.Textures.Count) {
    pFVar25 = TexMan.Textures.Array[TexMan.Translation.Array[uVar22]].Texture;
  }
  else {
    pFVar25 = (FTexture *)0x0;
  }
  if (pFVar25->UseType == '\r') {
    return;
  }
  uVar6 = SpriteFrames.Array[lVar21].Flip;
  if (pspr->firstTic == true) {
    pspr->firstTic = false;
    pspr->oldx = pspr->x;
    pspr->oldy = pspr->y;
  }
  pvVar13 = R_DrawPSprite::avis.Array;
  dVar27 = 0.0;
  dVar28 = 0.0;
  bVar26 = (pspr->Flags & 2U) != 0;
  if (bVar26) {
    dVar28 = (double)boby;
  }
  if (bVar26) {
    dVar27 = (double)bobx;
  }
  dVar27 = (pspr->x - pspr->oldx) * ticfrac + pspr->oldx + dVar27;
  dVar28 = (pspr->y - pspr->oldy) * ticfrac + pspr->oldy + dVar28;
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar27 = dVar27 + wx;
    dVar28 = dVar28 + wy;
  }
  dVar4 = (pFVar25->Scale).X;
  uVar23 = (uint)((double)(pFVar25->LeftOffset * 2) / dVar4);
  dVar29 = (dVar27 + -160.0) - (double)(int)((uVar23 & 1) + ((int)uVar23 >> 1));
  dVar27 = dVar29 * pspritexscale + CenterX + 6755399441055744.0;
  iVar24 = SUB84(dVar27,0);
  if (viewwidth < iVar24) {
    return;
  }
  uVar23 = (uint)((double)((uint)pFVar25->Width * 2) / dVar4);
  dVar4 = CenterX + 6755399441055744.0 +
          (dVar29 + (double)(int)((uVar23 & 1) + ((int)uVar23 >> 1))) * pspritexscale;
  iVar15 = SUB84(dVar4,0);
  if (iVar15 < 1) {
    return;
  }
  uVar22 = (ulong)vispspindex;
  vis = R_DrawPSprite::avis.Array + uVar22;
  R_DrawPSprite::avis.Array[uVar22].renderflags = (short)(owner->renderflags).Value;
  pvVar13[uVar22].floorclip = 0.0;
  pvVar13[uVar22].field_14.field_0.texturemid =
       (double)(int)pFVar25->TopOffset + (100.0 - dVar28) * (pFVar25->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = (pspr->Caller).field_0.o;
    if ((p != (DObject *)0x0) && ((p->ObjectFlags & 0x20) != 0)) {
      (pspr->Caller).field_0.p = (AActor *)0x0;
      p = (DObject *)0x0;
    }
    pAVar17 = dyn_cast<AWeapon>(p);
    if ((pAVar17 != (AWeapon *)0x0) && (fVar3 = pAVar17->YAdjust, fVar3 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar28 = (double)fVar3 * StatusBar->Displacement;
      }
      else {
        dVar28 = (double)fVar3;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar28;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    (vis->field_14).field_0.texturemid =
         (vis->field_14).field_0.texturemid - (double)BaseRatioSizes[WidescreenRatio][2];
  }
  fVar14 = 0;
  sVar20 = 0;
  if (0 < iVar24) {
    sVar20 = SUB82(dVar27,0);
  }
  vis->x1 = sVar20;
  sVar20 = (short)viewwidth;
  if (iVar15 < viewwidth) {
    sVar20 = SUB82(dVar4,0);
  }
  vis->x2 = sVar20;
  vis->xscale = SUB84(pspritexscale / (pFVar25->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (pFVar25->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = pFVar25;
  vis->ColormapNum = '\0';
  iVar15 = SUB84((pFVar25->Scale).X * pspritexiscale + 103079215104.0,0);
  if ((uVar6 & 1) == 0) {
    (vis->field_14).field_0.xiscale = iVar15;
  }
  else {
    (vis->field_14).field_0.xiscale = -iVar15;
    fVar14 = *(int *)&pFVar25->Width * 0x10000 + -1;
  }
  (vis->field_14).field_0.startfrac = fVar14;
  iVar15 = vis->x1 - iVar24;
  if (iVar15 != 0 && iVar24 <= vis->x1) {
    pfVar1 = &(vis->field_14).field_0.startfrac;
    *pfVar1 = *pfVar1 + iVar15 * (vis->field_14).field_0.xiscale;
  }
  pFVar18 = basecolormap;
  if (0x7ffffffc < pspr->ID) {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
    bVar26 = false;
    goto LAB_003191ce;
  }
  (vis->Style).Alpha = (float)owner->Alpha;
  (vis->Style).RenderStyle = owner->RenderStyle;
  bVar5 = (vis->Style).RenderStyle.field_0.Flags;
  uVar23 = (bVar5 & 0x20) >> 5 ^ 1;
  if ((bVar5 & 0x10) == 0) {
    uVar23 = bVar5 & 0x20;
  }
  pFVar18 = basecolormap;
  if ((bVar5 & 0x40) != 0) {
    fade_00.d = 0xffffff;
    if (uVar23 == 0) {
      fade_00.d = 0;
    }
    pFVar18 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                               basecolormap->Desaturate);
    uVar23 = 0;
  }
  pvVar2 = &vis->Style;
  if (realfixedcolormap == (FSpecialColormap *)0x0) {
    if (uVar23 != 0) {
      color = (pFVar18->Color).field_0.field_0;
      fade = PalEntry::InverseColor(&pFVar18->Fade);
      pFVar18 = GetSpecialLights((PalEntry)color,fade,pFVar18->Desaturate);
    }
    uVar22 = (ulong)fixedlightlev;
    if ((long)uVar22 < 0) {
      if ((foggy == false) && ((pspr->State->field_0x22 & 1) != 0)) {
        pBVar19 = pFVar18->Maps;
        goto LAB_00319098;
      }
      iVar15 = 0x1f;
      if (spriteshade._2_2_ < 0x1f) {
        iVar15 = (int)spriteshade._2_2_;
      }
      iVar16 = 0;
      if (0 < iVar15) {
        iVar16 = iVar15;
      }
      uVar22 = (ulong)(uint)(iVar16 << 8);
    }
    pBVar19 = pFVar18->Maps + uVar22;
  }
  else {
    pBVar19 = realfixedcolormap->Colormap;
  }
LAB_00319098:
  pvVar2->colormap = pBVar19;
  pAVar7 = (camera->Inventory).field_0.p;
  if (pAVar7 == (AInventory *)0x0) {
LAB_00319129:
    bVar26 = false;
  }
  else {
    if (((pAVar7->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
      (camera->Inventory).field_0.p = (AInventory *)0x0;
      goto LAB_00319129;
    }
    plVar8 = pvVar2->colormap;
    pAVar7 = (camera->Inventory).field_0.p;
    (*(pAVar7->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3f])(pAVar7,pvVar2);
    plVar9 = pvVar2->colormap;
    if (plVar9 == plVar8) goto LAB_00319129;
    bVar26 = true;
    if (((SpecialColormaps.Array)->Colormap <= plVar9) &&
       (plVar9 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
      bVar26 = pFVar18->Maps + 0x2000 <= plVar9 || plVar9 < pFVar18->Maps;
    }
  }
  bVar11 = bVar26;
  if (((r_shadercolormaps.Value == false) &&
      ((SpecialColormaps.Array)->Colormap <= pvVar2->colormap)) &&
     (bVar11 = true, SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar2->colormap)
     ) {
    bVar11 = bVar26;
  }
  bVar10 = true;
  if (NormalLight.Maps == realcolormaps) {
    bVar10 = bVar11;
  }
  if (pFVar18 != &NormalLight) {
    bVar10 = bVar11;
  }
  bVar26 = bVar10;
  if (((!bVar10) && (realfixedcolormap == (FSpecialColormap *)0x0)) &&
     ((pFVar18 == &NormalLight && ((NormalLightHasFixedLights & 1U) != 0)))) {
    iVar15 = (*((vis->field_13).pic)->_vptr_FTexture[5])();
    bVar26 = true;
    if ((char)iVar15 == '\0') {
      bVar26 = bVar10;
    }
  }
LAB_003191ce:
  if (((!bVar26) && ((DFrameBuffer *)RenderTarget == screen)) && (screen->Accel2D != false)) {
    local_34 = (FRenderStyle)*(FRenderStyle *)&(vis->Style).RenderStyle.field_0;
    FRenderStyle::CheckFuzz(&local_34);
    if (local_34.field_0.BlendOp != '\x04') {
      if (vispsprites.Count < vispspindex + 1) {
        uVar23 = (vispsprites.Count - vispspindex) + 1;
        TArray<vispsp_t,_vispsp_t>::Grow(&vispsprites,uVar23);
        vispsprites.Count = vispsprites.Count + uVar23;
      }
      pvVar12 = vispsprites.Array;
      uVar22 = (ulong)vispspindex;
      vispsprites.Array[uVar22].vis = vis;
      pvVar12[uVar22].basecolormap = pFVar18;
      pvVar12[uVar22].x1 = iVar24;
      vispspindex = vispspindex + 1;
      return;
    }
  }
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= BaseRatioSizes[WidescreenRatio][2];
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (flip)
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}